

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::TestCaseStats::TestCaseStats
          (TestCaseStats *this,string *className,string *name)

{
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0x28),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 0x48),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 0x68));
  std::__cxx11::string::string((string *)(in_RDI + 0x88));
  std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>::
  vector((vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>
          *)0x1ee17a);
  std::
  vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ::vector((vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
            *)0x1ee18b);
  return;
}

Assistant:

TestCaseStats( const std::string& className, const std::string& name )
            :   m_className( className ),
                m_name( name )
            {}